

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  undefined8 uVar7;
  void *pvVar8;
  ssize_t sVar9;
  long lVar10;
  char *pcVar11;
  archive_read *paVar12;
  ssize_t avail_in;
  ssize_t avail;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  void **local_38;
  
  puVar1 = (undefined8 *)self->data;
  puVar1[3] = puVar1[0xf];
  iVar5 = *(int *)(puVar1 + 0x10);
  *(int *)(puVar1 + 4) = iVar5;
  local_38 = p;
  do {
    if ((iVar5 == 0) || (*(char *)(puVar1 + 0x13) != '\0')) goto LAB_00109d1e;
    if (*(char *)(puVar1 + 0xe) == '\0') {
      puVar2 = (undefined8 *)self->data;
      bVar3 = false;
      sVar6 = peek_at_header(self->upstream,(int *)0x0);
      if (sVar6 == 0) {
        sVar9 = 1;
      }
      else {
        __archive_read_filter_consume(self->upstream,sVar6);
        uVar7 = crc32(0,0,0);
        puVar2[0x12] = uVar7;
        pvVar8 = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
        *puVar2 = pvVar8;
        *(undefined4 *)(puVar2 + 1) = local_40;
        uVar4 = inflateInit2_(puVar2,0xfffffff1,"1.2.11",0x70);
        switch(uVar4) {
        case 0:
          *(undefined1 *)(puVar2 + 0xe) = 1;
          bVar3 = false;
          sVar9 = 0;
          goto LAB_00109bee;
        case 0xfffffffa:
          paVar12 = self->archive;
          iVar5 = -1;
          pcVar11 = "Internal error initializing compression library: invalid library version";
          break;
        default:
          archive_set_error(&self->archive->archive,-1,
                            "Internal error initializing compression library:  Zlib error %d",
                            (ulong)uVar4);
          goto LAB_00109be5;
        case 0xfffffffc:
          paVar12 = self->archive;
          iVar5 = 0xc;
          pcVar11 = "Internal error initializing compression library: out of memory";
          break;
        case 0xfffffffe:
          paVar12 = self->archive;
          iVar5 = -1;
          pcVar11 = "Internal error initializing compression library: invalid setup parameter";
        }
        archive_set_error(&paVar12->archive,iVar5,pcVar11);
LAB_00109be5:
        sVar9 = -0x1e;
        bVar3 = true;
      }
LAB_00109bee:
      if (sVar6 == 0) {
        *(undefined1 *)(puVar1 + 0x13) = 1;
LAB_00109d1e:
        pvVar8 = (void *)puVar1[0xf];
        lVar10 = puVar1[3] - (long)pvVar8;
        puVar1[0x11] = puVar1[0x11] + lVar10;
        if (lVar10 == 0) {
          pvVar8 = (void *)0x0;
        }
        *local_38 = pvVar8;
        return lVar10;
      }
      if (bVar3) {
        return sVar9;
      }
    }
    pvVar8 = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_48);
    *puVar1 = pvVar8;
    if (pvVar8 == (void *)0x0) {
      paVar12 = self->archive;
      pcVar11 = "truncated gzip input";
LAB_00109d01:
      archive_set_error(&paVar12->archive,-1,pcVar11);
      return -0x1e;
    }
    *(undefined4 *)(puVar1 + 1) = local_48;
    iVar5 = inflate(puVar1,0);
    if (iVar5 == 1) {
      __archive_read_filter_consume
                (self->upstream,CONCAT44(uStack_44,local_48) - (ulong)*(uint *)(puVar1 + 1));
      *(undefined1 *)((long)self->data + 0x70) = 0;
      iVar5 = inflateEnd();
      if (iVar5 == 0) {
        pvVar8 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_40);
        sVar6 = -0x1e;
        bVar3 = true;
        if ((pvVar8 != (void *)0x0) && (CONCAT44(uStack_3c,local_40) != 0)) {
          __archive_read_filter_consume(self->upstream,8);
          bVar3 = false;
          sVar6 = 0;
        }
      }
      else {
        archive_set_error(&self->archive->archive,-1,"Failed to clean up gzip decompressor");
        sVar6 = -0x1e;
        bVar3 = true;
      }
      if (bVar3) {
        return sVar6;
      }
    }
    else {
      if (iVar5 != 0) {
        paVar12 = self->archive;
        pcVar11 = "gzip decompression failed";
        goto LAB_00109d01;
      }
      __archive_read_filter_consume
                (self->upstream,CONCAT44(uStack_44,local_48) - (ulong)*(uint *)(puVar1 + 1));
    }
    iVar5 = *(int *)(puVar1 + 4);
  } while( true );
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}